

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptMath.cpp
# Opt level: O1

Var Js::JavascriptMath::Divide_InPlace
              (Var aLeft,Var aRight,ScriptContext *scriptContext,JavascriptNumber *result)

{
  bool bVar1;
  Var pvVar2;
  JavascriptNumber *pJVar3;
  double value;
  
  bVar1 = TaggedInt::IsPair(aLeft,aRight);
  if (bVar1) {
    pvVar2 = TaggedInt::DivideInPlace(aLeft,aRight,scriptContext,result);
    return pvVar2;
  }
  value = Divide_Helper(aLeft,aRight,scriptContext);
  pJVar3 = JavascriptNumber::InPlaceNew(value,scriptContext,result);
  return pJVar3;
}

Assistant:

Var JavascriptMath::Divide_InPlace(Var aLeft, Var aRight, ScriptContext* scriptContext, JavascriptNumber* result)
        {
            JIT_HELPER_REENTRANT_HEADER(Op_DivideInPlace);
            // If both arguments are TaggedInt, then try to do integer division
            // This case is not handled by the lowerer.
            if (TaggedInt::IsPair(aLeft, aRight))
            {
                return TaggedInt::DivideInPlace(aLeft, aRight, scriptContext, result);
            }

            double quotient = Divide_Helper(aLeft, aRight, scriptContext);
            return JavascriptNumber::InPlaceNew(quotient, scriptContext, result);
            JIT_HELPER_END(Op_DivideInPlace);
        }